

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::SplitByteVector<brotli::Histogram<704>,unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *data,
               size_t literals_per_histogram,size_t max_histograms,size_t sampling_stride_length,
               double block_switch_cost,BlockSplit *split)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  allocator_type local_59;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> histograms;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_ids;
  
  puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    split->num_types = 1;
  }
  else {
    sVar3 = (long)puVar2 - (long)puVar1 >> 1;
    if (sVar3 < 0x80) {
      split->num_types = 1;
      histograms.
      super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)histograms.
                            super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&split->types,(uchar *)&histograms);
      histograms.
      super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(histograms.
                             super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)((ulong)((long)(data->
                                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(data->
                                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                )._M_impl.super__Vector_impl_data._M_start) >> 1));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&split->lengths,(uint *)&histograms);
    }
    else {
      histograms.
      super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      histograms.
      super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      histograms.
      super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      InitialEntropyCodes<brotli::Histogram<704>,unsigned_short>
                (puVar1,sVar3,literals_per_histogram,max_histograms,sampling_stride_length,
                 &histograms);
      puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      RefineEntropyCodes<brotli::Histogram<704>,unsigned_short>
                (puVar1,(long)(data->
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1,
                 sampling_stride_length,&histograms);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&block_ids,
                 (long)(data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 1,&local_59);
      lVar4 = 10;
      while( true ) {
        puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        sVar3 = (long)(data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1;
        bVar5 = lVar4 == 0;
        lVar4 = lVar4 + -1;
        if (bVar5) break;
        FindBlocks<unsigned_short,704>
                  (puVar1,sVar3,block_switch_cost,&histograms,
                   block_ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        BuildBlockHistograms<brotli::Histogram<704>,unsigned_short>
                  (puVar1,(long)(data->
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1,
                   block_ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,&histograms);
      }
      ClusterBlocks<brotli::Histogram<704>,unsigned_short>
                (puVar1,sVar3,
                 block_ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
      BuildBlockSplit(&block_ids,split);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&block_ids.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
      ~_Vector_base(&histograms.
                     super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                   );
    }
  }
  return;
}

Assistant:

void SplitByteVector(const std::vector<DataType>& data,
                     const size_t literals_per_histogram,
                     const size_t max_histograms,
                     const size_t sampling_stride_length,
                     const double block_switch_cost,
                     BlockSplit* split) {
  if (data.empty()) {
    split->num_types = 1;
    return;
  } else if (data.size() < kMinLengthForBlockSplitting) {
    split->num_types = 1;
    split->types.push_back(0);
    split->lengths.push_back(static_cast<uint32_t>(data.size()));
    return;
  }
  std::vector<HistogramType> histograms;
  // Find good entropy codes.
  InitialEntropyCodes(&data[0], data.size(),
                      literals_per_histogram,
                      max_histograms,
                      sampling_stride_length,
                      &histograms);
  RefineEntropyCodes(&data[0], data.size(),
                     sampling_stride_length,
                     &histograms);
  // Find a good path through literals with the good entropy codes.
  std::vector<uint8_t> block_ids(data.size());
  for (size_t i = 0; i < 10; ++i) {
    FindBlocks(&data[0], data.size(),
               block_switch_cost,
               histograms,
               &block_ids[0]);
    BuildBlockHistograms(&data[0], data.size(), &block_ids[0], &histograms);
  }
  ClusterBlocks<HistogramType>(&data[0], data.size(), &block_ids[0]);
  BuildBlockSplit(block_ids, split);
}